

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  secp256k1_ge *psVar4;
  secp256k1_ge *psVar5;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  secp256k1_fe dqy;
  secp256k1_ge gg;
  secp256k1_ge p;
  secp256k1_ge q;
  secp256k1_fe dqx;
  secp256k1_fe dpy;
  secp256k1_fe dpx;
  secp256k1_gej g2;
  
  bVar8 = 0;
  secp256k1_ge_from_storage(&p,pre_g);
  iVar1 = secp256k1_ge_is_valid_var(&p);
  if (iVar1 == 0) {
    pcVar6 = "test condition failed: secp256k1_ge_is_valid_var(&p)";
    uVar3 = 0x1043;
LAB_00136a21:
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,uVar3,pcVar6);
    abort();
  }
  secp256k1_gej_set_ge(&g2,&p);
  secp256k1_gej_double_var(&g2,&g2,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&gg,&g2);
  lVar7 = 0x40;
  do {
    if (lVar7 == 0x80000) {
      return;
    }
    secp256k1_fe_negate_unchecked(&dpx,&p.x,1);
    secp256k1_fe_add(&dpx,&gg.x);
    secp256k1_fe_normalize_weak(&dpx);
    secp256k1_fe_negate_unchecked(&dpy,&p.y,1);
    secp256k1_fe_add(&dpy,&gg.y);
    secp256k1_fe_normalize_weak(&dpy);
    iVar1 = secp256k1_fe_normalizes_to_zero_var(&dpx);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&dpy);
      if (iVar1 != 0) {
        pcVar6 = 
        "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy)"
        ;
        uVar3 = 0x104c;
        goto LAB_00136a21;
      }
    }
    secp256k1_ge_from_storage(&q,(secp256k1_ge_storage *)((long)(pre_g->x).n + lVar7));
    iVar1 = secp256k1_ge_is_valid_var(&q);
    if (iVar1 == 0) {
      pcVar6 = "test condition failed: secp256k1_ge_is_valid_var(&q)";
      uVar3 = 0x104f;
      goto LAB_00136a21;
    }
    secp256k1_fe_negate_unchecked(&dqx,&q.x,1);
    secp256k1_fe_add(&dqx,&gg.x);
    dqy.n[4] = q.y.n[4];
    dqy.magnitude = q.y.magnitude;
    dqy.normalized = q.y.normalized;
    dqy.n[2] = q.y.n[2];
    dqy.n[3] = q.y.n[3];
    dqy.n[0] = q.y.n[0];
    dqy.n[1] = q.y.n[1];
    secp256k1_fe_add(&dqy,&gg.y);
    iVar1 = secp256k1_fe_normalizes_to_zero_var(&dqx);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&dqy);
      if (iVar1 != 0) {
        pcVar6 = 
        "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy)"
        ;
        uVar3 = 0x1054;
        goto LAB_00136a21;
      }
    }
    iVar1 = secp256k1_fe_equal(&dpx,&dqx);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_equal(&dpy,&dqy);
      if (iVar1 != 0) {
        pcVar6 = 
        "test condition failed: !secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy)";
        uVar3 = 0x1057;
        goto LAB_00136a21;
      }
    }
    secp256k1_fe_mul(&dpx,&dpx,&dqy);
    secp256k1_fe_mul(&dpy,&dpy,&dqx);
    iVar1 = secp256k1_fe_equal(&dpx,&dpy);
    if (iVar1 == 0) {
      pcVar6 = "test condition failed: secp256k1_fe_equal(&dpx, &dpy)";
      uVar3 = 0x105c;
      goto LAB_00136a21;
    }
    psVar4 = &q;
    psVar5 = &p;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      (psVar5->x).n[0] = (psVar4->x).n[0];
      psVar4 = (secp256k1_ge *)((long)psVar4 + (ulong)bVar8 * -0x10 + 8);
      psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
    }
    lVar7 = lVar7 + 0x40;
  } while( true );
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}